

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O1

Range<float,_2> __thiscall Nova::Grid<float,_2>::Cell_Domain(Grid<float,_2> *this,T_INDEX *index)

{
  int i;
  long lVar1;
  long in_RDX;
  TV in_XMM1_Qa;
  Range<float,_2> RVar2;
  Vector<float,_2,_true> data_copy_2;
  TV corner;
  Vector<float,_2,_true> data_copy;
  
  lVar1 = 0;
  do {
    data_copy._data._M_elems[lVar1] = (float)*(int *)(in_RDX + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  lVar1 = 0;
  do {
    *(float *)((long)data_copy._data._M_elems + lVar1) =
         *(float *)((long)data_copy._data._M_elems + lVar1) *
         *(float *)((long)index[3]._data._M_elems + lVar1);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 8);
  corner._data._M_elems = (T_STORAGE)(T_STORAGE)*(_Type *)index[1]._data._M_elems;
  lVar1 = 0;
  do {
    *(float *)((long)corner._data._M_elems + lVar1) =
         *(float *)((long)corner._data._M_elems + lVar1) +
         *(float *)((long)data_copy._data._M_elems + lVar1);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 8);
  data_copy_2._data._M_elems = corner._data._M_elems;
  lVar1 = 0;
  do {
    RVar2.min_corner._data._M_elems[0] =
         *(float *)((long)data_copy_2._data._M_elems + lVar1) -
         *(float *)((long)index[3]._data._M_elems + lVar1);
    RVar2.min_corner._data._M_elems[1] = 0.0;
    *(float *)((long)data_copy_2._data._M_elems + lVar1) = RVar2.min_corner._data._M_elems[0];
    lVar1 = lVar1 + 4;
  } while (lVar1 != 8);
  *(T_STORAGE *)(this->counts)._data._M_elems = data_copy_2._data._M_elems;
  *(T_STORAGE *)(this->domain).min_corner._data._M_elems = corner._data._M_elems;
  RVar2.max_corner._data._M_elems = in_XMM1_Qa._data._M_elems;
  return RVar2;
}

Assistant:

Range<T,d> Cell_Domain(const T_INDEX& index) const
    {
        TV corner=domain.min_corner+TV(index)*dX;
        return Range<T,d>(corner-dX,corner);
    }